

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O0

phf_hash_t
phf_hash_<true,unsigned_char,unsigned_int>(uchar *g,uint k,uint32_t seed,size_t r,size_t m)

{
  uint32_t uVar1;
  uint32_t d;
  size_t m_local;
  size_t r_local;
  uint32_t seed_local;
  uint k_local;
  uchar *g_local;
  
  uVar1 = phf_g<unsigned_int>(k,seed);
  uVar1 = phf_f<unsigned_int>((uint)g[(ulong)uVar1 & r - 1],k,seed);
  return uVar1 & (int)m - 1U;
}

Assistant:

static inline phf_hash_t phf_hash_(map_t *g, key_t k, uint32_t seed, size_t r, size_t m) {
	if (nodiv) {
		uint32_t d = g[phf_g(k, seed) & (r - 1)];

		return phf_f(d, k, seed) & (m - 1);
	} else {
		uint32_t d = g[phf_g(k, seed) % r];

		return phf_f(d, k, seed) % m;
	}
}